

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void setLedState(GPIOClass *pledPin,string *new_state)

{
  pointer pcVar1;
  string local_38;
  
  pcVar1 = (new_state->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + new_state->_M_string_length);
  GPIOClass::setval_gpio(pledPin,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void setLedState(GPIOClass* pledPin, const string new_state)
{
    pledPin->setval_gpio(new_state);
}